

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O1

int b_shift(lua_State *L,lua_Unsigned r,lua_Integer i)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  ulong n;
  
  if (-1 < i) {
    n = 0;
    if (i < 0x20) {
      n = r << (i & 0x3fU) & 0xffffffff;
    }
    lua_pushinteger(L,n);
    return extraout_EAX;
  }
  if (i < -0x1f) {
    lua_pushinteger(L,0);
    return extraout_EAX_00;
  }
  lua_pushinteger(L,(r & 0xffffffff) >> ((ulong)(byte)-(char)i & 0x3f));
  return extraout_EAX_01;
}

Assistant:

static int b_shift (lua_State *L, lua_Unsigned r, lua_Integer i) {
  if (i < 0) {  /* shift right? */
    i = -i;
    r = trim(r);
    if (i >= LUA_NBITS) r = 0;
    else r >>= i;
  }
  else {  /* shift left */
    if (i >= LUA_NBITS) r = 0;
    else r <<= i;
    r = trim(r);
  }
  pushunsigned(L, r);
  return 1;
}